

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-graph.hxx
# Opt level: O2

void __thiscall
lineage::heuristics::PartitionGraph::updateEdgeCost(PartitionGraph *this,size_t edgeId,double delta)

{
  vector<double,_std::allocator<double>_> *this_00;
  pointer pdVar1;
  ulong uVar2;
  double local_20;
  value_type_conflict2 local_18;
  
  this_00 = &this->branchingEdgeCosts_;
  pdVar1 = (this->branchingEdgeCosts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (long)(this->branchingEdgeCosts_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3;
  local_20 = delta;
  if (uVar2 == edgeId) {
    std::vector<double,std::allocator<double>>::emplace_back<double&>
              ((vector<double,std::allocator<double>> *)this_00,&local_20);
  }
  else {
    if (uVar2 < edgeId) {
      local_18 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize(this_00,edgeId + 1,&local_18);
      pdVar1 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    pdVar1[edgeId] = delta + pdVar1[edgeId];
  }
  return;
}

Assistant:

void updateEdgeCost(size_t edgeId, double delta)
    {
        // NOTE you have to check whether the edge has vanished!
        if (edgeId == branchingEdgeCosts_.size()) {
            branchingEdgeCosts_.emplace_back(delta);
            return;
        } else if (edgeId > branchingEdgeCosts_.size()) {
            branchingEdgeCosts_.resize(edgeId + 1, 0);
        }
        branchingEdgeCosts_[edgeId] += delta;
    }